

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_partition_iterator.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::Set_partition_iterator::update_value(Set_partition_iterator *this)

{
  reference pvVar1;
  reference pvVar2;
  value_type_conflict2 local_18;
  uint local_14;
  uint i_1;
  uint i;
  Set_partition_iterator *this_local;
  
  _i_1 = this;
  for (local_14 = 0; local_14 < this->k_; local_14 = local_14 + 1) {
    pvVar1 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->value_,(ulong)local_14);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(pvVar1);
  }
  for (local_18 = 0; local_18 < this->n_; local_18 = local_18 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->rgs_,(ulong)local_18);
    pvVar1 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->value_,(ulong)*pvVar2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar1,&local_18);
  }
  return;
}

Assistant:

void update_value() {
    for (uint i = 0; i < k_; i++) value_[i].clear();
    for (uint i = 0; i < n_; i++) value_[rgs_[i]].push_back(i);
  }